

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::GraphicsRobustAccessPass::ProcessAFunction
          (GraphicsRobustAccessPass *this,Function *function)

{
  byte bVar1;
  BasicBlock *pBVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Instruction *inst;
  Instruction *pIVar5;
  vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *this_00;
  pointer puVar6;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> access_chains;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  image_texel_pointers;
  Instruction *local_80;
  undefined8 *local_78;
  undefined8 *puStack_70;
  long local_68;
  GraphicsRobustAccessPass *local_58;
  pointer local_50;
  void *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_78 = (undefined8 *)0x0;
  puStack_70 = (undefined8 *)0x0;
  local_68 = 0;
  local_38 = 0;
  local_48 = (void *)0x0;
  uStack_40 = 0;
  puVar6 = (function->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (function->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != local_50) {
    local_58 = this;
    do {
      pBVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      for (pIVar5 = *(Instruction **)
                     ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10
                     ); this = local_58, puVar4 = puStack_70,
          pIVar5 != (Instruction *)
                    ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U);
          pIVar5 = (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        this_00 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *
                  )&local_78;
        if ((pIVar5->opcode_ - OpAccessChain < 2) ||
           (this_00 = (vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                       *)&local_48, pIVar5->opcode_ == OpImageTexelPointer)) {
          local_80 = pIVar5;
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>(this_00,&local_80);
        }
      }
      puVar6 = puVar6 + 1;
      puVar3 = local_78;
    } while (puVar6 != local_50);
    do {
      if (puVar3 == puVar4) break;
      ClampIndicesForAccessChain(this,(Instruction *)*puVar3);
      puVar3 = puVar3 + 1;
    } while ((this->super_Pass).field_0x35 == '\0');
  }
  bVar1 = (this->super_Pass).field_0x34;
  if (local_48 != (void *)0x0) {
    operator_delete(local_48,local_38 - (long)local_48);
  }
  if (local_78 != (undefined8 *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool GraphicsRobustAccessPass::ProcessAFunction(opt::Function* function) {
  // Ensure that all pointers computed inside a function are within bounds.
  // Find the access chains in this block before trying to modify them.
  std::vector<Instruction*> access_chains;
  std::vector<Instruction*> image_texel_pointers;
  for (auto& block : *function) {
    for (auto& inst : block) {
      switch (inst.opcode()) {
        case spv::Op::OpAccessChain:
        case spv::Op::OpInBoundsAccessChain:
          access_chains.push_back(&inst);
          break;
        case spv::Op::OpImageTexelPointer:
          image_texel_pointers.push_back(&inst);
          break;
        default:
          break;
      }
    }
  }
  for (auto* inst : access_chains) {
    ClampIndicesForAccessChain(inst);
    if (module_status_.failed) return module_status_.modified;
  }

  for (auto* inst : image_texel_pointers) {
    if (SPV_SUCCESS != ClampCoordinateForImageTexelPointer(inst)) break;
  }
  return module_status_.modified;
}